

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

void __thiscall
Options::add_entry<std::__cxx11::string&>
          (Options *this,option *opt,char flag,string *long_flag,string *description,string *group,
          bool req_arg)

{
  _Rb_tree_header *p_Var1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  _Alloc_hider _Var5;
  _Base_ptr p_Var6;
  iterator iVar7;
  ostream *poVar8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_01;
  runtime_error *prVar9;
  _Base_ptr p_Var10;
  ushort uVar11;
  uint uVar12;
  size_type sVar13;
  ulong uVar14;
  size_type __n;
  Options *pOVar15;
  int iVar16;
  bool bVar17;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar18;
  string desc;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  Options *local_220;
  string *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string *local_1f0;
  ulong local_1e8;
  string *local_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_220 = this;
  local_218 = description;
  local_1f0 = group;
  if (flag == '\0') {
    if (long_flag->_M_string_length == 0) {
      return;
    }
    iVar16 = this->optval;
    this->optval = iVar16 + 1;
    opt->val = iVar16;
  }
  else {
    iVar16 = (int)flag;
    p_Var6 = (this->setters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var6 != (_Base_ptr)0x0) {
      p_Var1 = &(this->setters)._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = &p_Var1->_M_header;
      do {
        if (iVar16 <= (int)p_Var6[1]._M_color) {
          p_Var10 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < iVar16];
      } while (p_Var6 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var10 != p_Var1) && ((int)p_Var10[1]._M_color <= iVar16)) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Duplicate flag \'",0x10);
        local_240._M_dataplus._M_p._0_1_ = flag;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_240,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'",1);
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar9,(string *)&local_240);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&this->optstr,flag);
    if (req_arg) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&this->optstr,":");
    }
    opt->val = iVar16;
    pOVar15 = local_220;
    if (long_flag->_M_string_length == 0) goto LAB_0012aec3;
  }
  pOVar15 = local_220;
  this_00 = &local_220->long_flags;
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&this_00->_M_t,long_flag);
  if ((_Rb_tree_header *)iVar7._M_node != &(pOVar15->long_flags)._M_t._M_impl.super__Rb_tree_header)
  {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Duplicate long flag \"",0x15);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(long_flag->_M_dataplus)._M_p,long_flag->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&local_240);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pVar18 = std::
           _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
           ::_M_insert_unique<std::__cxx11::string_const&>
                     ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)this_00,long_flag);
  opt->name = *(char **)(pVar18.first._M_node._M_node + 1);
LAB_0012aec3:
  opt->flag = (int *)0x0;
  if (local_218->_M_string_length != 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    paVar2 = &local_240.field_2;
    local_240._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_240,(ulong)pOVar15->IndentFlag,' ');
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != paVar2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if (flag != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"-",1);
      local_240._M_dataplus._M_p._0_1_ = flag;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_240,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    }
    if (long_flag->_M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"--",2);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(long_flag->_M_dataplus)._M_p,long_flag->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    }
    std::__cxx11::stringbuf::str();
    sVar13 = local_260._M_string_length;
    uVar14 = (ulong)local_220->IndentDescription;
    __n = 1;
    if (local_260._M_string_length <= uVar14) {
      std::__cxx11::stringbuf::str();
      __n = uVar14 - local_1d0;
    }
    local_240._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_240,__n,' ');
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != paVar2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((sVar13 <= uVar14) && (local_1d8 != local_1c8)) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    puVar4 = (undefined1 *)
             CONCAT44(local_260._M_dataplus._M_p._4_4_,
                      CONCAT22(local_260._M_dataplus._M_p._2_2_,
                               CONCAT11(local_260._M_dataplus._M_p._1_1_,
                                        local_260._M_dataplus._M_p._0_1_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4 != &local_260.field_2) {
      operator_delete(puVar4,local_260.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = (local_218->_M_dataplus)._M_p;
    local_240._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_240,pcVar3,pcVar3 + local_218->_M_string_length);
    ioctl(0,0x5413,&local_260);
    uVar11 = 0x50;
    if (0x27 < local_260._M_dataplus._M_p._2_2_) {
      uVar11 = local_260._M_dataplus._M_p._2_2_;
    }
    std::__cxx11::stringbuf::str();
    pOVar15 = local_220;
    if ((float)(uVar11 - local_260._M_string_length) <= (float)uVar11 * 0.3) {
      uVar12 = local_220->IndentFlag + 2;
    }
    else {
      std::__cxx11::stringbuf::str();
      uVar12 = (uint)local_210._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
    }
    puVar4 = (undefined1 *)
             CONCAT44(local_260._M_dataplus._M_p._4_4_,
                      CONCAT22(local_260._M_dataplus._M_p._2_2_,
                               CONCAT11(local_260._M_dataplus._M_p._1_1_,
                                        local_260._M_dataplus._M_p._0_1_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4 != &local_260.field_2) {
      operator_delete(puVar4,local_260.field_2._M_allocated_capacity + 1);
    }
    if (uVar12 == pOVar15->IndentFlag + 2) {
      local_260._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_260,1);
    }
    if (local_240._M_string_length != 0) {
      local_218 = (string *)(ulong)(uVar11 - uVar12);
      paVar2 = &local_210.field_2;
      local_1e8 = (ulong)uVar12;
      sVar13 = 0;
      local_1e0 = local_218;
      do {
        while( true ) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_260,&local_240,sVar13,1);
          local_210._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_210," ","");
          _Var5._M_p = local_210._M_dataplus._M_p;
          if (local_260._M_string_length ==
              CONCAT44(local_210._M_string_length._4_4_,(uint)local_210._M_string_length)) {
            if (local_260._M_string_length == 0) {
              bVar17 = true;
            }
            else {
              iVar16 = bcmp((void *)CONCAT44(local_260._M_dataplus._M_p._4_4_,
                                             CONCAT22(local_260._M_dataplus._M_p._2_2_,
                                                      CONCAT11(local_260._M_dataplus._M_p._1_1_,
                                                               local_260._M_dataplus._M_p._0_1_))),
                            local_210._M_dataplus._M_p,local_260._M_string_length);
              bVar17 = iVar16 == 0;
            }
          }
          else {
            bVar17 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var5._M_p != paVar2) {
            operator_delete(_Var5._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          puVar4 = (undefined1 *)
                   CONCAT44(local_260._M_dataplus._M_p._4_4_,
                            CONCAT22(local_260._M_dataplus._M_p._2_2_,
                                     CONCAT11(local_260._M_dataplus._M_p._1_1_,
                                              local_260._M_dataplus._M_p._0_1_)));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar4 != &local_260.field_2) {
            operator_delete(puVar4,local_260.field_2._M_allocated_capacity + 1);
          }
          if (!bVar17) break;
          sVar13 = (ulong)((int)sVar13 + 1);
        }
        uVar14 = (ulong)(uint)((int)local_218 + (int)sVar13);
        if (uVar14 < local_240._M_string_length) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_260,&local_240,sVar13,(size_type)local_1e0);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,
                              (char *)CONCAT44(local_260._M_dataplus._M_p._4_4_,
                                               CONCAT22(local_260._M_dataplus._M_p._2_2_,
                                                        CONCAT11(local_260._M_dataplus._M_p._1_1_,
                                                                 local_260._M_dataplus._M_p._0_1_)))
                              ,local_260._M_string_length);
          local_210._M_dataplus._M_p._0_1_ = 10;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_210,1);
          local_210._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_210,local_1e8,' ');
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,local_210._M_dataplus._M_p,
                     CONCAT44(local_210._M_string_length._4_4_,(uint)local_210._M_string_length));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != paVar2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_260,&local_240,sVar13,0xffffffffffffffff);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,
                     (char *)CONCAT44(local_260._M_dataplus._M_p._4_4_,
                                      CONCAT22(local_260._M_dataplus._M_p._2_2_,
                                               CONCAT11(local_260._M_dataplus._M_p._1_1_,
                                                        local_260._M_dataplus._M_p._0_1_))),
                     local_260._M_string_length);
        }
        puVar4 = (undefined1 *)
                 CONCAT44(local_260._M_dataplus._M_p._4_4_,
                          CONCAT22(local_260._M_dataplus._M_p._2_2_,
                                   CONCAT11(local_260._M_dataplus._M_p._1_1_,
                                            local_260._M_dataplus._M_p._0_1_)));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar4 != &local_260.field_2) {
          operator_delete(puVar4,local_260.field_2._M_allocated_capacity + 1);
        }
        sVar13 = uVar14;
      } while (uVar14 < local_240._M_string_length);
    }
    this_01 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::operator[](&local_220->usage,local_1f0);
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(this_01,&local_260);
    puVar4 = (undefined1 *)
             CONCAT44(local_260._M_dataplus._M_p._4_4_,
                      CONCAT22(local_260._M_dataplus._M_p._2_2_,
                               CONCAT11(local_260._M_dataplus._M_p._1_1_,
                                        local_260._M_dataplus._M_p._0_1_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4 != &local_260.field_2) {
      operator_delete(puVar4,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

inline void Options::add_entry(struct option& opt, char flag, std::string long_flag, std::string description, std::string group, bool req_arg) {
    if (!flag && !long_flag.size()) return;

    if (flag) {
        if (this->setters.find((int)(flag)) != this->setters.end()) {
            std::stringstream ss;
            ss << "Duplicate flag '" << flag << "'";
            throw std::runtime_error(ss.str());
        }
        this->optstr += flag;
        if (req_arg) this->optstr += ":";

        opt.val = flag;
    } else {
        opt.val = this->optval++;
    }

    if (long_flag.size()) {
        if (this->long_flags.find(long_flag) != this->long_flags.end()) {
            std::stringstream ss;
            ss << "Duplicate long flag \"" << long_flag << "\"";
            throw std::runtime_error(ss.str());
        }
        opt.name = this->long_flags.insert(long_flag).first->c_str();
    }
    opt.flag = NULL;

    if (description.size()) {
        std::stringstream ss;
        ss << std::string(IndentFlag, ' ');

        if (flag) ss << "-" << flag << " ";
        if (long_flag.size()) ss << "--" << long_flag << " ";
        ss << std::string(ss.str().length() > IndentDescription ? 1 : IndentDescription - ss.str().length(), ' ');

        std::string desc(description);
        if (std::is_same<T, bool&>::value) desc.append(std::string(" <switch>"));

        unsigned width = tty_width();
        unsigned desc_pos = width - ss.str().length() > width * 0.3f ? (unsigned)ss.str().length() : IndentFlag + 2;
        unsigned column_width = width - desc_pos;
        if (desc_pos == IndentFlag + 2) ss << '\n';

        for (unsigned i = 0; i < desc.size(); i += column_width) {
            while (desc.substr(i, 1) == std::string(" ")) ++i;
            if (i + column_width < desc.size()) {
                ss << desc.substr(i, column_width) << '\n' << std::string(desc_pos, ' ');
            } else {
                ss << desc.substr(i);
            }
        }

        this->usage[group].push_back(ss.str());
    }
}